

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_api.cpp
# Opt level: O1

void __thiscall
cppcms::impl::cgi::connection::reader::operator()(reader *this,error_code *e,size_t read)

{
  char *pcVar1;
  connection *pcVar2;
  size_t sVar3;
  unsigned_long args_1;
  error_code local_60;
  reader local_50;
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              (&this->h,e,read + this->done);
    return;
  }
  pcVar1 = this->p;
  args_1 = this->done + read;
  sVar3 = this->s - read;
  this->s = sVar3;
  this->p = pcVar1 + read;
  this->done = args_1;
  if (sVar3 == 0) {
    local_60._M_value = 0;
    local_60._M_cat = (error_category *)std::_V2::system_category();
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::operator()
              (&this->h,&local_60,args_1);
  }
  else {
    pcVar2 = this->conn;
    local_50.h.call_ptr.p_ = (pointer_type)(this->h).call_ptr.p_;
    if (local_50.h.call_ptr.p_ != (callable<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
      booster::atomic_counter::inc();
    }
    local_50.s = this->s;
    local_50.done = this->done;
    local_50.p = this->p;
    local_50.conn = this->conn;
    booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
    callback<cppcms::impl::cgi::connection::reader>
              ((callback<void_(const_std::error_code_&,_unsigned_long)> *)&local_60,&local_50);
    (*pcVar2->_vptr_connection[0x11])(pcVar2,pcVar1 + read,sVar3,&local_60);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr((intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                    *)&local_60);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr((intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>
                    *)&local_50);
  }
  return;
}

Assistant:

void operator() (booster::system::error_code const &e=booster::system::error_code(),size_t read = 0)
	{
		if(e) {
			h(e,done+read);
			return;
		}
		s-=read;
		p+=read;
		done+=read;
		if(s==0)
			h(booster::system::error_code(),done);
		else
			conn->async_read_some(p,s,*this);
	}